

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int cvQuadEwtSet(CVodeMem cv_mem,N_Vector qcur,N_Vector weightQ)

{
  CVodeMem in_RDX;
  long in_RDI;
  int flag;
  N_Vector in_stack_ffffffffffffffd8;
  int iVar1;
  
  iVar1 = 0;
  if (*(int *)(in_RDI + 0x6c) == 1) {
    iVar1 = cvQuadEwtSetSS(in_RDX,(N_Vector)0x1,in_stack_ffffffffffffffd8);
  }
  else if (*(int *)(in_RDI + 0x6c) == 2) {
    iVar1 = cvQuadEwtSetSV(in_RDX,(N_Vector)0x2,in_stack_ffffffffffffffd8);
  }
  return iVar1;
}

Assistant:

static int cvQuadEwtSet(CVodeMem cv_mem, N_Vector qcur, N_Vector weightQ)
{
  int flag = 0;

  switch (cv_mem->cv_itolQ)
  {
  case CV_SS: flag = cvQuadEwtSetSS(cv_mem, qcur, weightQ); break;
  case CV_SV: flag = cvQuadEwtSetSV(cv_mem, qcur, weightQ); break;
  }

  return (flag);
}